

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec *
cram_external_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  cram_codec *c;
  int version_local;
  void *dat_local;
  cram_external_type option_local;
  cram_stats *st_local;
  
  st_local = (cram_stats *)malloc(0x240);
  if (st_local == (cram_stats *)0x0) {
    st_local = (cram_stats *)0x0;
  }
  else {
    st_local->freqs[0] = 1;
    *(code **)(st_local->freqs + 4) = cram_external_encode_free;
    if ((option == E_INT) || (option == E_LONG)) {
      *(code **)(st_local->freqs + 8) = cram_external_encode_int;
    }
    else {
      if ((option != E_BYTE_ARRAY) && (option != E_BYTE)) {
        abort();
      }
      *(code **)(st_local->freqs + 8) = cram_external_encode_char;
    }
    *(code **)(st_local->freqs + 10) = cram_external_encode_store;
    st_local->freqs[0xc] = (int)dat;
  }
  return (cram_codec *)st_local;
}

Assistant:

cram_codec *cram_external_encode_init(cram_stats *st,
				      enum cram_external_type option,
				      void *dat,
				      int version) {
    cram_codec *c;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_EXTERNAL;
    c->free = cram_external_encode_free;
    if (option == E_INT || option == E_LONG)
	c->encode = cram_external_encode_int;
    else if (option == E_BYTE_ARRAY || option == E_BYTE)
	c->encode = cram_external_encode_char;
    else
	abort();
    c->store = cram_external_encode_store;

    c->e_external.content_id = (size_t)dat;

    return c;
}